

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O0

TestInstance * __thiscall
vkt::
InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args,_vkt::NoPrograms1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args>_>
::createInstance(InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args,_vkt::NoPrograms1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args>_>
                 *this,Context *context)

{
  FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters> *this_00;
  Context *context_local;
  InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args,_vkt::NoPrograms1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args>_>
  *this_local;
  
  this_00 = (FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters> *)
            operator_new(0x30);
  FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::
  FunctionInstance1(this_00,context,&this->m_arg0);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance*	createInstance		(Context& context) const { return new Instance(context, m_arg0); }